

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

double __kmp_api_omp_get_wtick_(void)

{
  double data;
  double local_10;
  
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  __kmp_elapsed_tick(&local_10);
  return local_10;
}

Assistant:

double FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_WTICK)(void) {
#ifdef KMP_STUB
  return __kmps_get_wtick();
#else
  double data;
  if (!__kmp_init_serial) {
    __kmp_serial_initialize();
  }
  __kmp_elapsed_tick(&data);
  return data;
#endif
}